

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolver.cpp
# Opt level: O3

void __thiscall HighsMipSolver::cleanupSolve(HighsMipSolver *this)

{
  HighsMipAnalysis *this_00;
  double *pdVar1;
  HighsMipSolverData *pHVar2;
  HighsOptions *pHVar3;
  bool bVar4;
  int iVar5;
  undefined1 *__nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  char *pcVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined8 extraout_XMM0_Qa;
  double dVar10;
  double dVar11;
  array<char,_32UL> gapValString;
  string solutionstatus;
  array<char,_32UL> gapTolString;
  string local_118;
  char local_f8 [136];
  undefined1 *local_70;
  char *local_68;
  undefined1 local_60 [16];
  array<char,_32UL> local_50;
  
  HighsMipSolverData::printDisplayLine
            ((this->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,0xf);
  this_00 = &this->analysis_;
  bVar4 = HighsMipAnalysis::mipTimerRunning(this_00,2);
  if (bVar4) {
    HighsMipAnalysis::mipTimerStop(this_00,2);
  }
  pHVar2 = (this->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  HighsMipSolverData::updatePrimalDualIntegral
            (pHVar2,pHVar2->lower_bound,pHVar2->lower_bound,pHVar2->upper_bound,pHVar2->upper_bound,
             false,true);
  HighsMipAnalysis::mipTimerStart(this_00,3);
  dVar9 = this->solution_objective_;
  bVar4 = true;
  if (((dVar9 < INFINITY) &&
      (dVar8 = (this->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance,
      this->bound_violation_ <= dVar8)) && (this->integrality_violation_ <= dVar8)) {
    bVar4 = dVar8 < this->row_violation_;
  }
  pHVar2 = (this->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  dVar8 = pHVar2->lower_bound;
  this->dual_bound_ = dVar8;
  dVar10 = (pHVar2->objectiveFunction).objIntScale;
  if ((dVar10 != 0.0) || (dVar11 = dVar8, NAN(dVar10))) {
    dVar7 = ceil(dVar8 * dVar10 - pHVar2->feastol);
    dVar11 = dVar7 / dVar10;
    if (dVar7 / dVar10 <= dVar8) {
      dVar11 = dVar8;
    }
    this->dual_bound_ = dVar11;
  }
  dVar8 = this->model_->offset_;
  dVar11 = dVar11 + dVar8;
  dVar8 = dVar8 + pHVar2->upper_bound;
  this->primal_bound_ = dVar8;
  this->node_count_ = pHVar2->num_nodes;
  this->total_lp_iterations_ = pHVar2->total_lp_iterations;
  dVar10 = dVar8;
  if (dVar11 <= dVar8) {
    dVar10 = dVar11;
  }
  this->dual_bound_ = dVar10;
  this->primal_dual_integral_ = (pHVar2->primal_dual_integral).value;
  if (this->orig_model_->sense_ == kMaximize) {
    this->dual_bound_ = -dVar10;
    this->primal_bound_ = -dVar8;
  }
  if ((this->modelstatus_ & ~kInfeasible) == kMin) {
    this->modelstatus_ = (byte)(INFINITY <= dVar9 | bVar4) + kOptimal;
  }
  HighsMipAnalysis::mipTimerStop(this_00,3);
  HighsTimer::stop(&this->timer_,0);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-","");
  if (dVar9 < INFINITY) {
    dVar9 = (this->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance;
    pcVar6 = "feasible";
    if (dVar9 < this->row_violation_) {
      pcVar6 = "infeasible";
    }
    if (dVar9 < this->integrality_violation_ || dVar9 < this->bound_violation_) {
      pcVar6 = "infeasible";
    }
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,(ulong)pcVar6);
  }
  dVar9 = this->dual_bound_;
  dVar8 = this->primal_bound_;
  this->gap_ = ABS(dVar8 - dVar9);
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    if (INFINITY <= dVar8) goto LAB_002b2a5c;
    dVar8 = (dVar8 - dVar9) / dVar8;
    dVar9 = ABS(dVar8);
    this->gap_ = dVar9;
    if (ABS(dVar8) != INFINITY) goto LAB_002b29c0;
  }
  else {
    if ((dVar9 == 0.0) && (!NAN(dVar9))) {
      this->gap_ = 0.0;
      dVar9 = 0.0;
LAB_002b29c0:
      local_f8[0x78] = '\0';
      local_f8[0x79] = '\0';
      local_f8[0x7a] = '\0';
      local_f8[0x7b] = '\0';
      local_f8[0x7c] = '\0';
      local_f8[0x7d] = '\0';
      local_f8[0x7e] = '\0';
      local_f8[0x7f] = '\0';
      local_f8[0x74] = '\0';
      local_f8[0x75] = '\0';
      local_f8[0x76] = '\0';
      local_f8[0x77] = '\0';
      local_f8[0x70] = '\0';
      local_f8[0x71] = '\0';
      local_f8[0x72] = '\0';
      local_f8[0x73] = '\0';
      local_f8[0x6c] = '\0';
      local_f8[0x6d] = '\0';
      local_f8[0x6e] = '\0';
      local_f8[0x6f] = '\0';
      local_f8[0x68] = '\0';
      local_f8[0x69] = '\0';
      local_f8[0x6a] = '\0';
      local_f8[0x6b] = '\0';
      local_f8[100] = '\0';
      local_f8[0x65] = '\0';
      local_f8[0x66] = '\0';
      local_f8[0x67] = '\0';
      local_f8[0x60] = '\0';
      local_f8[0x61] = '\0';
      local_f8[0x62] = '\0';
      local_f8[99] = '\0';
      local_f8[0x5c] = '\0';
      local_f8[0x5d] = '\0';
      local_f8[0x5e] = '\0';
      local_f8[0x5f] = '\0';
      local_f8[0x58] = '\0';
      local_f8[0x59] = '\0';
      local_f8[0x5a] = '\0';
      local_f8[0x5b] = '\0';
      local_f8[0x54] = '\0';
      local_f8[0x55] = '\0';
      local_f8[0x56] = '\0';
      local_f8[0x57] = '\0';
      local_f8[0x50] = '\0';
      local_f8[0x51] = '\0';
      local_f8[0x52] = '\0';
      local_f8[0x53] = '\0';
      local_f8[0x4c] = '\0';
      local_f8[0x4d] = '\0';
      local_f8[0x4e] = '\0';
      local_f8[0x4f] = '\0';
      local_f8[0x48] = '\0';
      local_f8[0x49] = '\0';
      local_f8[0x4a] = '\0';
      local_f8[0x4b] = '\0';
      local_f8[0x44] = '\0';
      local_f8[0x45] = '\0';
      local_f8[0x46] = '\0';
      local_f8[0x47] = '\0';
      local_f8[0x40] = '\0';
      local_f8[0x41] = '\0';
      local_f8[0x42] = '\0';
      local_f8[0x43] = '\0';
      local_f8[0x3c] = '\0';
      local_f8[0x3d] = '\0';
      local_f8[0x3e] = '\0';
      local_f8[0x3f] = '\0';
      local_f8[0x38] = '\0';
      local_f8[0x39] = '\0';
      local_f8[0x3a] = '\0';
      local_f8[0x3b] = '\0';
      local_f8[0x34] = '\0';
      local_f8[0x35] = '\0';
      local_f8[0x36] = '\0';
      local_f8[0x37] = '\0';
      local_f8[0x30] = '\0';
      local_f8[0x31] = '\0';
      local_f8[0x32] = '\0';
      local_f8[0x33] = '\0';
      local_f8[0x2c] = '\0';
      local_f8[0x2d] = '\0';
      local_f8[0x2e] = '\0';
      local_f8[0x2f] = '\0';
      local_f8[0x28] = '\0';
      local_f8[0x29] = '\0';
      local_f8[0x2a] = '\0';
      local_f8[0x2b] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      local_f8[0x20] = '\0';
      local_f8[0x21] = '\0';
      local_f8[0x22] = '\0';
      local_f8[0x23] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = '\0';
      local_f8[0x18] = '\0';
      local_f8[0x19] = '\0';
      local_f8[0x1a] = '\0';
      local_f8[0x1b] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[8] = '\0';
      local_f8[9] = '\0';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      dVar8 = dVar9 * 0.1;
      if (0.01 <= dVar8) {
        dVar8 = 0.01;
      }
      dVar10 = 1e-06;
      if (1e-06 <= dVar8) {
        dVar10 = dVar8;
      }
      highsDoubleToString((array<char,_32UL> *)&local_118,dVar9 * 100.0,dVar10);
      pHVar3 = this->options_mip_;
      dVar9 = (pHVar3->super_HighsOptionsStruct).mip_rel_gap;
      dVar8 = (pHVar3->super_HighsOptionsStruct).mip_abs_gap;
      pdVar1 = &(pHVar3->super_HighsOptionsStruct).mip_feasibility_tolerance;
      dVar10 = dVar9;
      if (dVar8 < *pdVar1 || dVar8 == *pdVar1) {
LAB_002b2a3a:
        if ((dVar10 != 0.0) || (NAN(dVar10))) {
          if (dVar10 < INFINITY) {
            dVar9 = dVar10 * 0.1;
            if (0.01 <= dVar9) {
              dVar9 = 0.01;
            }
            dVar8 = 1e-06;
            if (1e-06 <= dVar9) {
              dVar8 = dVar9;
            }
            highsDoubleToString(&local_50,dVar10 * 100.0,dVar8);
            snprintf(local_f8,0x80,"%s%% (tolerance: %s%%)",&local_118,&local_50);
            goto LAB_002b2b39;
          }
          goto LAB_002b2b1c;
        }
        pcVar6 = "%s%%";
      }
      else {
        dVar11 = this->primal_bound_;
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          dVar10 = dVar8 / ABS(dVar11);
          if (dVar8 / ABS(dVar11) <= dVar9) {
            dVar10 = dVar9;
          }
          goto LAB_002b2a3a;
        }
LAB_002b2b1c:
        pcVar6 = "%s%% (tolerance: inf)";
      }
      snprintf(local_f8,0x80,pcVar6,&local_118);
      goto LAB_002b2b39;
    }
LAB_002b2a5c:
    this->gap_ = INFINITY;
  }
  local_f8[0x70] = '\0';
  local_f8[0x71] = '\0';
  local_f8[0x72] = '\0';
  local_f8[0x73] = '\0';
  local_f8[0x6c] = '\0';
  local_f8[0x6d] = '\0';
  local_f8[0x6e] = '\0';
  local_f8[0x6f] = '\0';
  local_f8[0x68] = '\0';
  local_f8[0x69] = '\0';
  local_f8[0x6a] = '\0';
  local_f8[0x6b] = '\0';
  local_f8[100] = '\0';
  local_f8[0x65] = '\0';
  local_f8[0x66] = '\0';
  local_f8[0x67] = '\0';
  local_f8[0x60] = '\0';
  local_f8[0x61] = '\0';
  local_f8[0x62] = '\0';
  local_f8[99] = '\0';
  local_f8[0x5c] = '\0';
  local_f8[0x5d] = '\0';
  local_f8[0x5e] = '\0';
  local_f8[0x5f] = '\0';
  local_f8[0x58] = '\0';
  local_f8[0x59] = '\0';
  local_f8[0x5a] = '\0';
  local_f8[0x5b] = '\0';
  local_f8[0x54] = '\0';
  local_f8[0x55] = '\0';
  local_f8[0x56] = '\0';
  local_f8[0x57] = '\0';
  local_f8[0x50] = '\0';
  local_f8[0x51] = '\0';
  local_f8[0x52] = '\0';
  local_f8[0x53] = '\0';
  local_f8[0x4c] = '\0';
  local_f8[0x4d] = '\0';
  local_f8[0x4e] = '\0';
  local_f8[0x4f] = '\0';
  local_f8[0x48] = '\0';
  local_f8[0x49] = '\0';
  local_f8[0x4a] = '\0';
  local_f8[0x4b] = '\0';
  local_f8[0x44] = '\0';
  local_f8[0x45] = '\0';
  local_f8[0x46] = '\0';
  local_f8[0x47] = '\0';
  local_f8[0x40] = '\0';
  local_f8[0x41] = '\0';
  local_f8[0x42] = '\0';
  local_f8[0x43] = '\0';
  local_f8[0x3c] = '\0';
  local_f8[0x3d] = '\0';
  local_f8[0x3e] = '\0';
  local_f8[0x3f] = '\0';
  local_f8[0x38] = '\0';
  local_f8[0x39] = '\0';
  local_f8[0x3a] = '\0';
  local_f8[0x3b] = '\0';
  local_f8[0x34] = '\0';
  local_f8[0x35] = '\0';
  local_f8[0x36] = '\0';
  local_f8[0x37] = '\0';
  local_f8[0x30] = '\0';
  local_f8[0x31] = '\0';
  local_f8[0x32] = '\0';
  local_f8[0x33] = '\0';
  local_f8[0x2c] = '\0';
  local_f8[0x2d] = '\0';
  local_f8[0x2e] = '\0';
  local_f8[0x2f] = '\0';
  local_f8[0x28] = '\0';
  local_f8[0x29] = '\0';
  local_f8[0x2a] = '\0';
  local_f8[0x2b] = '\0';
  local_f8[0x24] = '\0';
  local_f8[0x25] = '\0';
  local_f8[0x26] = '\0';
  local_f8[0x27] = '\0';
  local_f8[0x20] = '\0';
  local_f8[0x21] = '\0';
  local_f8[0x22] = '\0';
  local_f8[0x23] = '\0';
  local_f8[0x1c] = '\0';
  local_f8[0x1d] = '\0';
  local_f8[0x1e] = '\0';
  local_f8[0x1f] = '\0';
  local_f8[0x18] = '\0';
  local_f8[0x19] = '\0';
  local_f8[0x1a] = '\0';
  local_f8[0x1b] = '\0';
  local_f8[0x14] = '\0';
  local_f8[0x15] = '\0';
  local_f8[0x16] = '\0';
  local_f8[0x17] = '\0';
  local_f8[0x10] = '\0';
  local_f8[0x11] = '\0';
  local_f8[0x12] = '\0';
  local_f8[0x13] = '\0';
  local_f8[0xc] = '\0';
  local_f8[0xd] = '\0';
  local_f8[0xe] = '\0';
  local_f8[0xf] = '\0';
  local_f8[8] = '\0';
  local_f8[9] = '\0';
  local_f8[10] = '\0';
  local_f8[0xb] = '\0';
  local_f8[4] = '\0';
  local_f8[5] = '\0';
  local_f8[6] = '\0';
  local_f8[7] = '\0';
  local_f8[0x78] = '\0';
  local_f8[0x79] = '\0';
  local_f8[0x7a] = '\0';
  local_f8[0x7b] = '\0';
  local_f8[0x7c] = '\0';
  local_f8[0x7d] = '\0';
  local_f8[0x7e] = '\0';
  local_f8[0x7f] = '\0';
  local_f8[0x74] = '\0';
  local_f8[0x75] = '\0';
  local_f8[0x76] = '\0';
  local_f8[0x77] = '\0';
  builtin_strncpy(local_f8,"inf",4);
LAB_002b2b39:
  bVar4 = (this->options_mip_->super_HighsOptionsStruct).timeless_log;
  highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
               "\nSolving report\n");
  if ((this->orig_model_->model_name_)._M_string_length != 0) {
    highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "  Model             %s\n",(this->orig_model_->model_name_)._M_dataplus._M_p);
  }
  pHVar3 = this->options_mip_;
  utilModelStatusToString_abi_cxx11_(&local_118,this->modelstatus_);
  highsLogUser(&(pHVar3->super_HighsOptionsStruct).log_options,kInfo,
               "  Status            %s\n  Primal bound      %.12g\n  Dual bound        %.12g\n  Gap               %s\n"
               ,this->primal_bound_,this->dual_bound_,local_118._M_dataplus._M_p,local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (bVar4 == false) {
    highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "  P-D integral      %.12g\n",
                 (((this->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                 primal_dual_integral).value);
  }
  __nbytes = local_70;
  highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
               "  Solution status   %s\n");
  iVar5 = std::__cxx11::string::compare((char *)&local_70);
  __buf = extraout_RDX;
  if (iVar5 != 0) {
    highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                 "                    %.12g (objective)\n                    %.12g (bound viol.)\n                    %.12g (int. viol.)\n                    %.12g (row viol.)\n"
                 ,this->solution_objective_,this->bound_violation_,this->integrality_violation_,
                 this->row_violation_);
    __buf = extraout_RDX_00;
  }
  if (bVar4 == false) {
    pHVar3 = this->options_mip_;
    HighsTimer::read(&this->timer_,0,__buf,(size_t)__nbytes);
    dVar9 = HighsMipAnalysis::mipTimerRead(this_00,1);
    dVar8 = HighsMipAnalysis::mipTimerRead(this_00,2);
    dVar10 = HighsMipAnalysis::mipTimerRead(this_00,3);
    highsLogUser(&(pHVar3->super_HighsOptionsStruct).log_options,kInfo,
                 "  Timing            %.2f (total)\n                    %.2f (presolve)\n                    %.2f (solve)\n                    %.2f (postsolve)\n"
                 ,extraout_XMM0_Qa,dVar9,dVar8,dVar10);
  }
  pHVar2 = (this->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  highsLogUser(&(this->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
               "  Max sub-MIP depth %d\n  Nodes             %llu\n  Repair LPs        %llu (%llu feasible; %llu iterations)\n  LP iterations     %llu (total)\n                    %llu (strong br.)\n                    %llu (separation)\n                    %llu (heuristics)\n"
               ,(ulong)(uint)this->max_submip_level,pHVar2->num_nodes,pHVar2->total_repair_lp,
               pHVar2->total_repair_lp_feasible,pHVar2->total_repair_lp_iterations,
               pHVar2->total_lp_iterations,pHVar2->sb_lp_iterations,pHVar2->sepa_lp_iterations,
               pHVar2->heuristic_lp_iterations);
  if (bVar4 == false) {
    HighsMipAnalysis::reportMipTimer(this_00);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void HighsMipSolver::cleanupSolve() {
  // Force a final logging line
  mipdata_->printDisplayLine(kSolutionSourceCleanup);
  // Stop the solve clock - which won't be running if presolve
  // determines the model status
  if (analysis_.mipTimerRunning(kMipClockSolve))
    analysis_.mipTimerStop(kMipClockSolve);

  // Need to complete the calculation of P-D integral, checking for NO
  // gap change
  mipdata_->updatePrimalDualIntegral(
      mipdata_->lower_bound, mipdata_->lower_bound, mipdata_->upper_bound,
      mipdata_->upper_bound, false);
  analysis_.mipTimerStart(kMipClockPostsolve);

  bool havesolution = solution_objective_ != kHighsInf;
  bool feasible;
  if (havesolution)
    feasible =
        bound_violation_ <= options_mip_->mip_feasibility_tolerance &&
        integrality_violation_ <= options_mip_->mip_feasibility_tolerance &&
        row_violation_ <= options_mip_->mip_feasibility_tolerance;
  else
    feasible = false;

  dual_bound_ = mipdata_->lower_bound;
  if (mipdata_->objectiveFunction.isIntegral()) {
    double rounded_lower_bound =
        std::ceil(mipdata_->lower_bound *
                      mipdata_->objectiveFunction.integralScale() -
                  mipdata_->feastol) /
        mipdata_->objectiveFunction.integralScale();
    dual_bound_ = std::max(dual_bound_, rounded_lower_bound);
  }
  dual_bound_ += model_->offset_;
  primal_bound_ = mipdata_->upper_bound + model_->offset_;
  node_count_ = mipdata_->num_nodes;
  total_lp_iterations_ = mipdata_->total_lp_iterations;
  dual_bound_ = std::min(dual_bound_, primal_bound_);
  primal_dual_integral_ = mipdata_->primal_dual_integral.value;

  // adjust objective sense in case of maximization problem
  if (orig_model_->sense_ == ObjSense::kMaximize) {
    dual_bound_ = -dual_bound_;
    primal_bound_ = -primal_bound_;
  }

  if (modelstatus_ == HighsModelStatus::kNotset ||
      modelstatus_ == HighsModelStatus::kInfeasible) {
    if (feasible && havesolution)
      modelstatus_ = HighsModelStatus::kOptimal;
    else
      modelstatus_ = HighsModelStatus::kInfeasible;
  }

  analysis_.mipTimerStop(kMipClockPostsolve);
  timer_.stop();

  std::string solutionstatus = "-";

  if (havesolution) {
    bool feasible =
        bound_violation_ <= options_mip_->mip_feasibility_tolerance &&
        integrality_violation_ <= options_mip_->mip_feasibility_tolerance &&
        row_violation_ <= options_mip_->mip_feasibility_tolerance;
    solutionstatus = feasible ? "feasible" : "infeasible";
  }

  gap_ = fabs(primal_bound_ - dual_bound_);
  if (primal_bound_ == 0.0)
    gap_ = dual_bound_ == 0.0 ? 0.0 : kHighsInf;
  else if (primal_bound_ != kHighsInf)
    gap_ = fabs(primal_bound_ - dual_bound_) / fabs(primal_bound_);
  else
    gap_ = kHighsInf;

  std::array<char, 128> gapString = {};

  if (gap_ == kHighsInf)
    std::strcpy(gapString.data(), "inf");
  else {
    double printTol = std::max(std::min(1e-2, 1e-1 * gap_), 1e-6);
    auto gapValString = highsDoubleToString(100.0 * gap_, printTol);
    double gapTol = options_mip_->mip_rel_gap;

    if (options_mip_->mip_abs_gap > options_mip_->mip_feasibility_tolerance) {
      gapTol = primal_bound_ == 0.0
                   ? kHighsInf
                   : std::max(gapTol,
                              options_mip_->mip_abs_gap / fabs(primal_bound_));
    }

    if (gapTol == 0.0)
      std::snprintf(gapString.data(), gapString.size(), "%s%%",
                    gapValString.data());
    else if (gapTol != kHighsInf) {
      printTol = std::max(std::min(1e-2, 1e-1 * gapTol), 1e-6);
      auto gapTolString = highsDoubleToString(100.0 * gapTol, printTol);
      std::snprintf(gapString.data(), gapString.size(),
                    "%s%% (tolerance: %s%%)", gapValString.data(),
                    gapTolString.data());
    } else
      std::snprintf(gapString.data(), gapString.size(), "%s%% (tolerance: inf)",
                    gapValString.data());
  }

  bool timeless_log = options_mip_->timeless_log;
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "\nSolving report\n");
  if (this->orig_model_->model_name_.length())
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  Model             %s\n",
                 this->orig_model_->model_name_.c_str());
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Status            %s\n"
               "  Primal bound      %.12g\n"
               "  Dual bound        %.12g\n"
               "  Gap               %s\n",
               utilModelStatusToString(modelstatus_).c_str(), primal_bound_,
               dual_bound_, gapString.data());
  if (!timeless_log)
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  P-D integral      %.12g\n",
                 mipdata_->primal_dual_integral.value);
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Solution status   %s\n", solutionstatus.c_str());
  if (solutionstatus != "-")
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "                    %.12g (objective)\n"
                 "                    %.12g (bound viol.)\n"
                 "                    %.12g (int. viol.)\n"
                 "                    %.12g (row viol.)\n",
                 solution_objective_, bound_violation_, integrality_violation_,
                 row_violation_);
  if (!timeless_log)
    highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
                 "  Timing            %.2f (total)\n"
                 "                    %.2f (presolve)\n"
                 "                    %.2f (solve)\n"
                 "                    %.2f (postsolve)\n",
                 timer_.read(), analysis_.mipTimerRead(kMipClockPresolve),
                 analysis_.mipTimerRead(kMipClockSolve),
                 analysis_.mipTimerRead(kMipClockPostsolve));
  highsLogUser(options_mip_->log_options, HighsLogType::kInfo,
               "  Max sub-MIP depth %d\n"
               "  Nodes             %llu\n"
               "  Repair LPs        %llu (%llu feasible; %llu iterations)\n"
               "  LP iterations     %llu (total)\n"
               "                    %llu (strong br.)\n"
               "                    %llu (separation)\n"
               "                    %llu (heuristics)\n",
               int(max_submip_level), (long long unsigned)mipdata_->num_nodes,
               (long long unsigned)mipdata_->total_repair_lp,
               (long long unsigned)mipdata_->total_repair_lp_feasible,
               (long long unsigned)mipdata_->total_repair_lp_iterations,
               (long long unsigned)mipdata_->total_lp_iterations,
               (long long unsigned)mipdata_->sb_lp_iterations,
               (long long unsigned)mipdata_->sepa_lp_iterations,
               (long long unsigned)mipdata_->heuristic_lp_iterations);

  if (!timeless_log) analysis_.reportMipTimer();

  assert(modelstatus_ != HighsModelStatus::kNotset);
}